

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::AlpsNewCodepointTest_Enabled_Test::TestBody
          (AlpsNewCodepointTest_Enabled_Test *this)

{
  UniquePtr<SSL> *out_client;
  int iVar1;
  char *in_R9;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  string local_50;
  AssertionResult gtest_ar_;
  
  SetUpExpectedNewCodePoint
            ((this->super_AlpsNewCodepointTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  out_client = &(this->super_AlpsNewCodepointTest).client_;
  gtest_ar_.success_ =
       CreateClientAndServer
                 (out_client,&(this->super_AlpsNewCodepointTest).server_,
                  (this->super_AlpsNewCodepointTest).client_ctx_._M_t.
                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                  (this->super_AlpsNewCodepointTest).server_ctx_._M_t.
                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    SSL_set_alps_use_new_codepoint
              ((this->super_AlpsNewCodepointTest).client_._M_t.
               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    SSL_set_alps_use_new_codepoint
              ((this->super_AlpsNewCodepointTest).server_._M_t.
               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1);
    AlpsNewCodepointTest::SetUpApplicationSetting(&this->super_AlpsNewCodepointTest);
    gtest_ar_.success_ =
         CompleteHandshakes((this->super_AlpsNewCodepointTest).client_._M_t.
                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                            (this->super_AlpsNewCodepointTest).server_._M_t.
                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar1 = SSL_has_application_settings
                        ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 != 0;
      if (gtest_ar_.success_) goto LAB_001b88b2;
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&gtest_ar_,
                 (AssertionResult *)"SSL_has_application_settings(client_.get())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x22c6,local_50._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    }
    else {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&gtest_ar_,
                 (AssertionResult *)"CompleteHandshakes(client_.get(), server_.get())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x22c5,local_50._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    }
  }
  else {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&gtest_ar_,
               (AssertionResult *)
               "CreateClientAndServer(&client_, &server_, client_ctx_.get(), server_ctx_.get())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x22bf,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  std::__cxx11::string::~string((string *)&local_50);
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
LAB_001b88b2:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(AlpsNewCodepointTest, Enabled) {
  SetUpExpectedNewCodePoint(server_ctx_.get());

  ASSERT_TRUE(CreateClientAndServer(&client_, &server_, client_ctx_.get(),
                                    server_ctx_.get()));

  SSL_set_alps_use_new_codepoint(client_.get(), 1);
  SSL_set_alps_use_new_codepoint(server_.get(), 1);

  SetUpApplicationSetting();
  ASSERT_TRUE(CompleteHandshakes(client_.get(), server_.get()));
  ASSERT_TRUE(SSL_has_application_settings(client_.get()));
}